

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr * __thiscall c4::yml::Tree::val_ref(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  csubstr *pcVar3;
  NodeType_e NVar4;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar4 = this->m_buf[node].m_type.type;
  if ((char)NVar4 < '\0') {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          pcVar3 = (csubstr *)(*pcVar1)();
          return pcVar3;
        }
      }
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      NVar4 = this->m_buf[node].m_type.type;
    }
    if ((NVar4 & (SEQ|MAP|VAL)) == NOTYPE || ((uint)NVar4 >> 9 & 1) == 0) goto LAB_001e65fc;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pcVar3 = (csubstr *)(*pcVar1)();
      return pcVar3;
    }
  }
  (*(code *)PTR_error_impl_002394c8)
            ("check failed: is_val_ref(node) && ! has_val_anchor(node)",0x38,
             (anonymous_namespace)::s_default_callbacks);
LAB_001e65fc:
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return &this->m_buf[node].m_val.anchor;
}

Assistant:

csubstr    const& val_ref   (size_t node) const { RYML_ASSERT(is_val_ref(node) && ! has_val_anchor(node)); return _p(node)->m_val.anchor; }